

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O2

void inject_activation_handler(int code,siginfo_t *siginfo,void *context)

{
  int iVar1;
  long lVar2;
  __pid_t _Var3;
  BOOL BVar4;
  long in_FS_OFFSET;
  undefined1 local_508 [8];
  CONTEXT winContext;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (siginfo->_sifields)._pad[0];
  _Var3 = getpid();
  if ((iVar1 == _Var3) && (g_activationFunction != (PAL_ActivationFunction)0x0)) {
    if (g_safeActivationCheckFunction == (PAL_SafeActivationCheckFunction)0x0) {
      fprintf(_stderr,"] %s %s:%d","inject_activation_handler",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/exception/signal.cpp"
              ,0x1b4);
      fprintf(_stderr,"Expression: g_safeActivationCheckFunction != NULL\n");
    }
    CONTEXTFromNativeContext((native_context_t *)context,(LPCONTEXT)local_508,0x10000b);
    BVar4 = (*g_safeActivationCheckFunction)(winContext.R15,1);
    if (BVar4 != 0) {
      (*g_activationFunction)((CONTEXT *)local_508);
    }
    CONTEXTToNativeContext((CONTEXT *)local_508,(native_context_t *)context);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void inject_activation_handler(int code, siginfo_t *siginfo, void *context)
{
    // Only accept activations from the current process
    if (siginfo->si_pid == getpid())
    {
        if (g_activationFunction != NULL)
        {
            _ASSERTE(g_safeActivationCheckFunction != NULL);

            native_context_t *ucontext = (native_context_t *)context;

            CONTEXT winContext;
            CONTEXTFromNativeContext(
                ucontext,
                &winContext,
                CONTEXT_CONTROL | CONTEXT_INTEGER | CONTEXT_FLOATING_POINT);

            if (g_safeActivationCheckFunction(CONTEXTGetPC(&winContext), true))
            {
                g_activationFunction(&winContext);
            }

            // Activation function may have modified the context, so update it.
            CONTEXTToNativeContext(&winContext, ucontext);
        }
    }
}